

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O3

S2Point * S2::FromFrame(Matrix3x3_d *m,S2Point *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  S2Point *in_RDI;
  
  dVar1 = q->c_[2];
  dVar2 = m->m_[2][2];
  dVar8 = q->c_[0];
  dVar9 = q->c_[1];
  dVar3 = m->m_[1][0];
  dVar4 = m->m_[1][1];
  dVar5 = m->m_[1][2];
  dVar6 = m->m_[2][0];
  dVar7 = m->m_[2][1];
  in_RDI->c_[0] = m->m_[0][2] * dVar1 + m->m_[0][0] * dVar8 + dVar9 * m->m_[0][1];
  in_RDI->c_[1] = dVar5 * dVar1 + dVar4 * dVar9 + dVar8 * dVar3;
  in_RDI->c_[2] = dVar9 * dVar7 + dVar6 * dVar8 + dVar2 * dVar1;
  return in_RDI;
}

Assistant:

S2Point FromFrame(const Matrix3x3_d& m, const S2Point& q) {
  return m * q;
}